

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcsutil.c
# Opt level: O3

int ffxypx(double xpos,double ypos,double xref,double yref,double xrefpix,double yrefpix,double xinc
          ,double yinc,double rot,char *type,double *xpix,double *ypix,int *status)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double local_118;
  double local_c8;
  
  if (*type != '-') goto switchD_001b91fa_caseD_4f;
  dVar2 = cos(rot * 0.01745329252);
  dVar3 = sin(rot * 0.01745329252);
  if (((xinc == 0.0) && (!NAN(xinc))) || ((yinc == 0.0 && (!NAN(yinc))))) {
    *xpix = 0.0;
    *ypix = 0.0;
LAB_001b90c7:
    *status = 0x1f6;
    return 0x1f6;
  }
  uVar7 = -(ulong)(180.0 < xpos - xref);
  uVar8 = -(ulong)(xpos - xref < -180.0);
  dVar12 = (double)(~uVar7 & (ulong)xpos | (ulong)(xpos + -360.0) & uVar7);
  dVar26 = (double)(uVar8 & (ulong)(dVar12 + 360.0) | ~uVar8 & (ulong)dVar12);
  dVar12 = dVar26 - xref;
  *xpix = (dVar12 * dVar2 + (ypos - yref) * dVar3) / xinc + xrefpix;
  *ypix = ((ypos - yref) * dVar2 - dVar3 * dVar12) / yinc + yrefpix;
  if (type[1] == 'C') {
    if ((type[2] != 'A') || (type[3] != 'R')) goto switchD_001b91fa_caseD_4f;
    goto LAB_001b9e24;
  }
  dVar24 = xref * 0.01745329252;
  dVar25 = yref * 0.01745329252;
  dVar26 = dVar26 * 0.01745329252;
  local_c8 = ypos * 0.01745329252;
  dVar12 = cos(local_c8);
  dVar15 = sin(local_c8);
  local_118 = cos(dVar25);
  dVar13 = sin(dVar25);
  dVar18 = dVar26 - dVar24;
  dVar23 = sin(dVar18);
  dVar23 = dVar23 * dVar12;
  dVar21 = cos(dVar18);
  bVar1 = type[1];
  if (bVar1 - 0x4d < 8) {
    dVar21 = dVar12 * local_118 * dVar21 + dVar15 * dVar13;
    switch((uint)bVar1) {
    case 0x4d:
      if ((type[2] != 'E') || (type[3] != 'R')) goto switchD_001b91fa_caseD_4f;
      dVar12 = yinc * dVar2 + dVar3 * xinc;
      uVar7 = -(ulong)(dVar12 == 0.0);
      dVar23 = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)dVar12);
      dVar26 = (yref * 0.5 + 45.0) * 0.01745329252;
      dVar12 = tan(dVar26);
      dVar12 = log(dVar12);
      dVar26 = tan(dVar23 * 0.5 * 0.01745329252 + dVar26);
      dVar26 = log(dVar26);
      dVar15 = cos(dVar25);
      dVar13 = tan(local_c8 * 0.5 + 0.7853981633974487);
      if (dVar13 < 1e-05) goto LAB_001b90c7;
      dVar21 = (dVar23 * 0.01745329252) / (dVar26 - dVar12);
      dVar23 = dVar18 * (double)(~-(ulong)(0.0 < dVar15) & 0x3ff0000000000000 |
                                -(ulong)(0.0 < dVar15) & (ulong)dVar15);
      dVar26 = log(dVar13);
      local_c8 = dVar26 * dVar21 - dVar12 * dVar21;
      break;
    case 0x4e:
      if ((type[2] != 'C') || (type[3] != 'P')) goto switchD_001b91fa_caseD_4f;
      if ((dVar25 == 0.0) && (!NAN(dVar25))) goto LAB_001b9842;
      dVar26 = cos(dVar25);
      dVar15 = cos(dVar18);
      local_c8 = sin(dVar25);
      local_c8 = (dVar26 - dVar12 * dVar15) / local_c8;
      break;
    default:
switchD_001b91fa_caseD_4f:
      *status = 0x1f8;
      return 0x1f8;
    case 0x53:
      if (type[2] == 'T') {
        if (type[3] != 'G') goto switchD_001b91fa_caseD_4f;
        if (1.5707963267948974 < ABS(local_c8)) {
LAB_001b9842:
          *status = 0x1f5;
          return 0x1f5;
        }
        dVar26 = sin(dVar25);
        dVar13 = cos(dVar25);
        dVar21 = cos(dVar18);
        local_118 = dVar21 * dVar13 * dVar12 + dVar26 * dVar15 + 1.0;
        if (ABS(local_118) < 1e-05) goto LAB_001b9842;
        local_118 = 2.0 / local_118;
LAB_001b97ab:
        dVar23 = dVar23 * local_118;
        dVar26 = cos(dVar25);
        dVar13 = sin(dVar25);
        dVar18 = cos(dVar18);
        local_c8 = (dVar15 * dVar26 - dVar13 * dVar12 * dVar18) * local_118;
      }
      else {
        if ((type[2] != 'I') || (type[3] != 'N')) goto switchD_001b91fa_caseD_4f;
        if (dVar21 < 0.0) goto LAB_001b9842;
        dVar26 = cos(dVar25);
        dVar13 = sin(dVar25);
        dVar18 = cos(dVar18);
        local_c8 = dVar15 * dVar26 - dVar13 * dVar12 * dVar18;
      }
      break;
    case 0x54:
      if ((type[2] != 'A') || (type[3] != 'N')) goto switchD_001b91fa_caseD_4f;
      if (dVar21 <= 0.0) goto LAB_001b9842;
      if (0.001 <= local_118) {
        local_c8 = (dVar15 / dVar21 - dVar13) / local_118;
      }
      else {
        dVar18 = cos(dVar18);
        dVar15 = (dVar18 * dVar12) / (dVar15 * dVar13);
        local_c8 = (local_118 * (dVar15 * dVar15 + 1.0) - dVar15) / dVar13;
      }
      dVar15 = sin(dVar24);
      local_118 = -local_118;
      if (0.3 <= ABS(dVar15)) {
        dVar26 = cos(dVar26);
        dVar15 = cos(dVar24);
        dVar18 = cos(dVar24);
        dVar23 = dVar18 * local_c8 * dVar13 + local_118 * dVar15 + (dVar12 * dVar26) / dVar21;
        dVar12 = sin(dVar24);
        uVar11 = (uint)((ulong)dVar12 >> 0x20) ^ 0x80000000;
        uVar9 = SUB84(dVar12,0);
      }
      else {
        dVar26 = sin(dVar26);
        dVar15 = sin(dVar24);
        dVar18 = sin(dVar24);
        dVar23 = dVar18 * local_c8 * dVar13 + local_118 * dVar15 + (dVar12 * dVar26) / dVar21;
        dVar12 = cos(dVar24);
        uVar9 = SUB84(dVar12,0);
        uVar11 = (uint)((ulong)dVar12 >> 0x20);
      }
      dVar23 = dVar23 / (double)CONCAT44(uVar11,uVar9);
    }
  }
  else if (bVar1 == 0x41) {
    if (type[2] != 'I') {
      if ((type[2] != 'R') || (type[3] != 'C')) goto switchD_001b91fa_caseD_4f;
      dVar26 = sin(dVar25);
      dVar13 = cos(dVar25);
      dVar21 = cos(dVar18);
      dVar13 = dVar26 * dVar15 + dVar21 * dVar13 * dVar12;
      dVar26 = -1.0;
      if (-1.0 <= dVar13) {
        dVar26 = dVar13;
      }
      uVar9 = 0;
      uVar10 = 0x3ff00000;
      local_118 = 1.0;
      if (dVar26 <= 1.0) {
        uVar9 = SUB84(dVar26,0);
        uVar10 = (undefined4)((ulong)dVar26 >> 0x20);
      }
      dVar26 = acos((double)CONCAT44(uVar10,uVar9));
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        local_118 = sin(dVar26);
        local_118 = dVar26 / local_118;
      }
      goto LAB_001b97ab;
    }
    if (type[3] != 'T') goto switchD_001b91fa_caseD_4f;
    dVar18 = dVar18 * 0.5;
    if (1.5707963267948974 < ABS(dVar18)) goto LAB_001b9842;
    dVar12 = yinc * dVar2 + dVar3 * xinc;
    uVar7 = -(ulong)(dVar12 == 0.0);
    dVar15 = (double)(uVar7 & 0x3f91df46a252dd11 | ~uVar7 & (ulong)(dVar12 * 0.01745329252));
    dVar12 = dVar25 + dVar15;
    dVar26 = sin(dVar12);
    dVar12 = cos(dVar12);
    dVar12 = (dVar12 + 1.0) * 0.5;
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar13 = sin(dVar25);
    dVar23 = cos(dVar25);
    dVar23 = (dVar23 + 1.0) * 0.5;
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      dVar23 = SQRT(dVar23);
    }
    dVar21 = xinc * dVar2 - dVar3 * yinc;
    uVar7 = -(ulong)(dVar21 == 0.0);
    dVar6 = (double)(uVar7 & 0x3f91df46a252dd11 | ~uVar7 & (ulong)(dVar21 * 0.01745329252));
    dVar21 = cos(dVar25);
    dVar24 = dVar6 * 0.5;
    dVar17 = sin(dVar24);
    dVar4 = cos(dVar25);
    dVar24 = cos(dVar24);
    dVar24 = (dVar24 * dVar4 + 1.0) * 0.5;
    if (dVar24 < 0.0) {
      dVar24 = sqrt(dVar24);
    }
    else {
      dVar24 = SQRT(dVar24);
    }
    dVar4 = sin(dVar25);
    dVar25 = cos(dVar25);
    dVar25 = (dVar25 + 1.0) * 0.5;
    if (dVar25 < 0.0) {
      dVar25 = sqrt(dVar25);
    }
    else {
      dVar25 = SQRT(dVar25);
    }
    dVar14 = cos(local_c8);
    dVar5 = cos(dVar18);
    dVar14 = (dVar5 * dVar14 + 1.0) * 0.5;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    if (ABS(dVar14) < 1e-05) {
      *status = 0x1f7;
      return 0x1f7;
    }
    dVar17 = (dVar21 + dVar21) * dVar17;
    uVar7 = -(ulong)(dVar17 == 0.0);
    auVar19._8_8_ = dVar13;
    auVar19._0_8_ = dVar26;
    auVar16._8_8_ = dVar23;
    auVar16._0_8_ = dVar12;
    auVar20 = divpd(auVar19,auVar16);
    dVar12 = auVar20._0_8_ - auVar20._8_8_;
    uVar8 = -(ulong)(dVar12 == 0.0);
    dVar15 = dVar15 / (double)(uVar8 & 0x3ff0000000000000 | ~uVar8 & (ulong)dVar12);
    dVar13 = (dVar6 * dVar24) / (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)dVar17);
    dVar12 = cos(local_c8);
    dVar26 = sin(dVar18);
    dVar23 = (dVar26 * dVar12 * (dVar13 + dVar13)) / dVar14;
    dVar12 = sin(local_c8);
    auVar22._0_8_ = dVar12 * dVar15;
    auVar22._8_8_ = dVar4 * dVar15;
    auVar20._8_4_ = SUB84(dVar25,0);
    auVar20._0_8_ = dVar14;
    auVar20._12_4_ = (int)((ulong)dVar25 >> 0x20);
    auVar20 = divpd(auVar22,auVar20);
    local_c8 = auVar20._0_8_ - auVar20._8_8_;
  }
  else {
    if (((bVar1 != 0x47) || (type[2] != 'L')) || (type[3] != 'S')) goto switchD_001b91fa_caseD_4f;
    if ((1.5707963267948974 < ABS(local_c8)) || (1.5707963267948974 < ABS(dVar25)))
    goto LAB_001b9842;
    local_c8 = local_c8 - dVar25;
    dVar23 = dVar18 * dVar12;
  }
  *xpix = ((dVar23 / 0.01745329252) * dVar2 + dVar3 * (local_c8 / 0.01745329252)) / xinc + xrefpix;
  *ypix = ((local_c8 / 0.01745329252) * dVar2 - dVar3 * (dVar23 / 0.01745329252)) / yinc + yrefpix;
LAB_001b9e24:
  return *status;
}

Assistant:

int ffxypx(double xpos, double ypos, double xref, double yref, 
      double xrefpix, double yrefpix, double xinc, double yinc, double rot,
      char *type, double *xpix, double *ypix, int *status)

/* This routine is based on the classic AIPS WCS routine. 

   It converts from RA,Dec to pixel location to for 9 projective geometries:
   "-CAR", "-SIN", "-TAN", "-ARC", "-NCP", "-GLS", "-MER", "-AIT" and "-STG".
*/
/*-----------------------------------------------------------------------*/
/* routine to determine accurate pixel coordinates for an RA and Dec     */
/* returns 0 if successful otherwise:                                    */
/* 501 = angle too large for projection;                                 */
/* 502 = bad values                                                      */
/* does: -SIN, -TAN, -ARC, -NCP, -GLS, -MER, -AIT projections            */
/* anything else is linear                                               */
/* Input:                                                                */
/*   d   xpos    x (RA) coordinate (deg)                                 */
/*   d   ypos    y (dec) coordinate (deg)                                */
/*   d   xref    x reference coordinate value (deg)                      */
/*   d   yref    y reference coordinate value (deg)                      */
/*   f   xrefpix x reference pixel                                       */
/*   f   yrefpix y reference pixel                                       */
/*   f   xinc    x coordinate increment (deg)                            */
/*   f   yinc    y coordinate increment (deg)                            */
/*   f   rot     rotation (deg)  (from N through E)                      */
/*   c  *type    projection type code e.g. "-SIN";                       */
/* Output:                                                               */
/*   f  *xpix    x pixel number  (RA or long without rotation)           */
/*   f  *ypiy    y pixel number  (dec or lat without rotation)           */
/*-----------------------------------------------------------------------*/
 {
  double dx, dy, dz, r, ra0, dec0, ra, dec, coss, sins, dt, da, dd, sint;
  double l, m, geo1, geo2, geo3, sinr, cosr, cos0, sin0;
  double deps=1.0e-5;
  char *cptr;

  if (*type != '-') {  /* unrecognized projection code */
     return(*status = 504);
  }

  cptr = type + 1;

  dt = (xpos - xref);
  if (dt >  180) xpos -= 360;
  if (dt < -180) xpos += 360;
  /* NOTE: changing input argument xpos is OK (call-by-value in C!) */

  /* default values - linear */
  dx = xpos - xref;
  dy = ypos - yref;

  /*  Correct for rotation */
  r = rot * D2R;
  cosr = cos (r);
  sinr = sin (r);
  dz = dx*cosr + dy*sinr;
  dy = dy*cosr - dx*sinr;
  dx = dz;

  /*     check axis increments - bail out if either 0 */
  if ((xinc==0.0) || (yinc==0.0)) {*xpix=0.0; *ypix=0.0;
    return(*status = 502);}

  /*     convert to pixels  */
  *xpix = dx / xinc + xrefpix;
  *ypix = dy / yinc + yrefpix;

  if (*cptr == 'C') { /* linear -CAR */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }

      return(*status);  /* done if linear */
  }

  /* Non linear position */
  ra0 = xref * D2R;
  dec0 = yref * D2R;
  ra = xpos * D2R;
  dec = ypos * D2R;

  /* compute direction cosine */
  coss = cos (dec);
  sins = sin (dec);
  cos0 = cos (dec0);
  sin0 = sin (dec0);
  l = sin(ra-ra0) * coss;
  sint = sins * sin0 + coss * cos0 * cos(ra-ra0);

    /* process by case  */
    if (*cptr == 'T') {  /* -TAN tan */
         if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'N') {
           return(*status = 504);
         }

         if (sint<=0.0)
	   return(*status = 501);
         if( cos0<0.001 ) {
            /* Do a first order expansion around pole */
            m = (coss * cos(ra-ra0)) / (sins * sin0);
            m = (-m + cos0 * (1.0 + m*m)) / sin0;
         } else {
            m = ( sins/sint - sin0 ) / cos0;
         }
	 if( fabs(sin(ra0)) < 0.3 ) {
	    l  = coss*sin(ra)/sint - cos0*sin(ra0) + m*sin(ra0)*sin0;
	    l /= cos(ra0);
	 } else {
	    l  = coss*cos(ra)/sint - cos0*cos(ra0) + m*cos(ra0)*sin0;
	    l /= -sin(ra0);
	 }

    } else if (*cptr == 'S') {

      if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'N') { /* -SIN */
         if (sint<0.0)
	   return(*status = 501);
         m = sins * cos(dec0) - coss * sin(dec0) * cos(ra-ra0);

      } else if (*(cptr + 1) == 'T' &&  *(cptr + 2) == 'G') {  /* -STG Sterographic*/
         da = ra - ra0;
         if (fabs(dec)>TWOPI/4.0)
	   return(*status = 501);
         dd = 1.0 + sins * sin(dec0) + coss * cos(dec0) * cos(da);
         if (fabs(dd)<deps)
	   return(*status = 501);
         dd = 2.0 / dd;
         l = l * dd;
         m = dd * (sins * cos(dec0) - coss * sin(dec0) * cos(da));

        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'A') {

      if (*(cptr + 1) == 'R' &&  *(cptr + 2) == 'C') { /* ARC */
         m = sins * sin(dec0) + coss * cos(dec0) * cos(ra-ra0);
         if (m<-1.0) m = -1.0;
         if (m>1.0) m = 1.0;
         m = acos (m);
         if (m!=0) 
            m = m / sin(m);
         else
            m = 1.0;
         l = l * m;
         m = (sins * cos(dec0) - coss * sin(dec0) * cos(ra-ra0)) * m;

      } else if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'T') {  /* -AIT Aitoff */
         da = (ra - ra0) / 2.0;
         if (fabs(da)>TWOPI/4.0)
	     return(*status = 501);
         dt = yinc*cosr + xinc*sinr;
         if (dt==0.0) dt = 1.0;
         dt = dt * D2R;
         dy = yref * D2R;
         dx = sin(dy+dt)/sqrt((1.0+cos(dy+dt))/2.0) -
             sin(dy)/sqrt((1.0+cos(dy))/2.0);
         if (dx==0.0) dx = 1.0;
         geo2 = dt / dx;
         dt = xinc*cosr - yinc* sinr;
         if (dt==0.0) dt = 1.0;
         dt = dt * D2R;
         dx = 2.0 * cos(dy) * sin(dt/2.0);
         if (dx==0.0) dx = 1.0;
         geo1 = dt * sqrt((1.0+cos(dy)*cos(dt/2.0))/2.0) / dx;
         geo3 = geo2 * sin(dy) / sqrt((1.0+cos(dy))/2.0);
         dt = sqrt ((1.0 + cos(dec) * cos(da))/2.0);
         if (fabs(dt)<deps)
	     return(*status = 503);
         l = 2.0 * geo1 * cos(dec) * sin(da) / dt;
         m = geo2 * sin(dec) / dt - geo3;

        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'N') { /* -NCP North celestial pole*/
         if (*(cptr + 1) != 'C' ||  *(cptr + 2) != 'P') {
             return(*status = 504);
         }

         if (dec0==0.0) 
	     return(*status = 501);  /* can't stand the equator */
         else
	   m = (cos(dec0) - coss * cos(ra-ra0)) / sin(dec0);

    } else if (*cptr == 'G') {   /* -GLS global sinusoid */
         if (*(cptr + 1) != 'L' ||  *(cptr + 2) != 'S') {
             return(*status = 504);
         }

         dt = ra - ra0;
         if (fabs(dec)>TWOPI/4.0)
	   return(*status = 501);
         if (fabs(dec0)>TWOPI/4.0)
	   return(*status = 501);
         m = dec - dec0;
         l = dt * coss;

    } else if (*cptr == 'M') {  /* -MER mercator*/
         if (*(cptr + 1) != 'E' ||  *(cptr + 2) != 'R') {
             return(*status = 504);
         }

         dt = yinc * cosr + xinc * sinr;
         if (dt==0.0) dt = 1.0;
         dy = (yref/2.0 + 45.0) * D2R;
         dx = dy + dt / 2.0 * D2R;
         dy = log (tan (dy));
         dx = log (tan (dx));
         geo2 = dt * D2R / (dx - dy);
         geo3 = geo2 * dy;
         geo1 = cos (yref*D2R);
         if (geo1<=0.0) geo1 = 1.0;
         dt = ra - ra0;
         l = geo1 * dt;
         dt = dec / 2.0 + TWOPI / 8.0;
         dt = tan (dt);
         if (dt<deps)
	   return(*status = 502);
         m = geo2 * log (dt) - geo3;

    } else  {
      return(*status = 504);
    }

    /*   convert to degrees  */
    dx = l / D2R;
    dy = m / D2R;

    /*  Correct for rotation */
    dz = dx*cosr + dy*sinr;
    dy = dy*cosr - dx*sinr;
    dx = dz;

    /*     convert to pixels  */
    *xpix = dx / xinc + xrefpix;
    *ypix = dy / yinc + yrefpix;
    return(*status);
}